

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_operator.cpp
# Opt level: O0

bool __thiscall duckdb::PhysicalOperator::AllSourcesSupportBatchIndex(PhysicalOperator *this)

{
  bool bVar1;
  int iVar2;
  long *in_RDI;
  reference_wrapper<const_duckdb::PhysicalOperator> *source;
  iterator __end1;
  iterator __begin1;
  vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true> *__range1;
  vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true> sources;
  undefined6 in_stack_ffffffffffffff78;
  byte in_stack_ffffffffffffff7e;
  byte in_stack_ffffffffffffff7f;
  PhysicalOperator *in_stack_ffffffffffffff80;
  undefined1 local_68 [32];
  reference local_48;
  reference_wrapper<const_duckdb::PhysicalOperator> *local_40;
  __normal_iterator<std::reference_wrapper<const_duckdb::PhysicalOperator>_*,_std::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>_>
  local_38;
  undefined1 *local_30;
  undefined1 local_28 [39];
  byte local_1;
  
  (**(code **)(*in_RDI + 0x128))(local_28);
  local_30 = local_28;
  local_38._M_current =
       (reference_wrapper<const_duckdb::PhysicalOperator> *)
       std::
       vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
       ::begin((vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
                *)CONCAT17(in_stack_ffffffffffffff7f,
                           CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)));
  local_40 = (reference_wrapper<const_duckdb::PhysicalOperator> *)
             std::
             vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
             ::end((vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
                    *)CONCAT17(in_stack_ffffffffffffff7f,
                               CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)));
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::reference_wrapper<const_duckdb::PhysicalOperator>_*,_std::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>_>
                        *)in_stack_ffffffffffffff80,
                       (__normal_iterator<std::reference_wrapper<const_duckdb::PhysicalOperator>_*,_std::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff7f,
                                   CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)));
    if (!bVar1) {
      local_1 = 1;
LAB_007a0310:
      vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>::~vector
                ((vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true> *)0x7a031a);
      return (bool)(local_1 & 1);
    }
    local_48 = __gnu_cxx::
               __normal_iterator<std::reference_wrapper<const_duckdb::PhysicalOperator>_*,_std::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>_>
               ::operator*(&local_38);
    in_stack_ffffffffffffff80 =
         std::reference_wrapper<const_duckdb::PhysicalOperator>::get(local_48);
    OperatorPartitionInfo::BatchIndex();
    iVar2 = (*in_stack_ffffffffffffff80->_vptr_PhysicalOperator[0x15])
                      (in_stack_ffffffffffffff80,local_68);
    in_stack_ffffffffffffff7f = (byte)iVar2;
    in_stack_ffffffffffffff7e = in_stack_ffffffffffffff7f ^ 0xff;
    OperatorPartitionInfo::~OperatorPartitionInfo((OperatorPartitionInfo *)0x7a02a9);
    if ((in_stack_ffffffffffffff7e & 1) != 0) {
      local_1 = 0;
      goto LAB_007a0310;
    }
    __gnu_cxx::
    __normal_iterator<std::reference_wrapper<const_duckdb::PhysicalOperator>_*,_std::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>_>
    ::operator++(&local_38);
  } while( true );
}

Assistant:

bool PhysicalOperator::AllSourcesSupportBatchIndex() const {
	auto sources = GetSources();
	for (auto &source : sources) {
		if (!source.get().SupportsPartitioning(OperatorPartitionInfo::BatchIndex())) {
			return false;
		}
	}
	return true;
}